

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O2

void __thiscall Assimp::FBX::Node::DumpPropertiesAscii(Node *this,ostream *s,int indent)

{
  size_t i;
  ulong uVar1;
  pointer pFVar2;
  long lVar3;
  
  lVar3 = 0;
  for (uVar1 = 0;
      pFVar2 = (this->properties).
               super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar1 < (ulong)((long)(this->properties).
                            super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar2 >> 5);
      uVar1 = uVar1 + 1) {
    if (uVar1 != 0) {
      std::operator<<(s,", ");
      pFVar2 = (this->properties).
               super__Vector_base<Assimp::FBX::FBXExportProperty,_std::allocator<Assimp::FBX::FBXExportProperty>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    FBX::FBXExportProperty::DumpAscii((FBXExportProperty *)(&pFVar2->type + lVar3),s,indent);
    lVar3 = lVar3 + 0x20;
  }
  return;
}

Assistant:

void FBX::Node::DumpPropertiesAscii(std::ostream &s, int indent)
{
    for (size_t i = 0; i < properties.size(); ++i) {
        if (i > 0) { s << ", "; }
        properties[i].DumpAscii(s, indent);
    }
}